

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::do_get(basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
         *this,size_type index)

{
  bool bVar1;
  size_type sVar2;
  type tVar3;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *pvVar4;
  uint in_EDX;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RSI;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RDI;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *val;
  size_type num_args;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *pbVar5;
  
  pbVar5 = in_RDI;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  ::basic_format_arg(in_RDI);
  bVar1 = is_packed(in_RSI);
  if (bVar1) {
    if (in_EDX < 0x10) {
      tVar3 = type(in_RSI,in_EDX);
      pbVar5->type_ = tVar3;
      if (pbVar5->type_ != none_type) {
        pvVar4 = (in_RSI->field_1).values_;
        (pbVar5->value_).field_0.long_long_value = pvVar4[in_EDX].field_0.long_long_value;
        (pbVar5->value_).field_0.string.size = pvVar4[in_EDX].field_0.string.size;
      }
    }
  }
  else {
    sVar2 = max_size(in_RSI);
    if (in_EDX < sVar2) {
      pvVar4 = (in_RSI->field_1).values_ + (ulong)in_EDX * 2;
      (pbVar5->value_).field_0.long_long_value = (pvVar4->field_0).long_long_value;
      (pbVar5->value_).field_0.string.size = (pvVar4->field_0).string.size;
      pbVar5->type_ = pvVar4[1].field_0.int_value;
    }
  }
  return in_RDI;
}

Assistant:

format_arg do_get(size_type index) const {
    format_arg arg;
    if (!is_packed()) {
      auto num_args = max_size();
      if (index < num_args)
        arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }